

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_reader.cxx
# Opt level: O0

size_t __thiscall
xray_re::xr_reader::r_raw_chunk(xr_reader *this,uint32_t id,void *dest,size_t dest_size)

{
  xr_reader *dest_size_00;
  size_t size;
  xr_reader *pxStack_30;
  bool compressed;
  size_t dest_size_local;
  void *dest_local;
  xr_reader *pxStack_18;
  uint32_t id_local;
  xr_reader *this_local;
  
  pxStack_30 = (xr_reader *)dest_size;
  dest_size_local = (size_t)dest;
  dest_local._4_4_ = id;
  pxStack_18 = this;
  dest_size_00 = (xr_reader *)find_chunk(this,id,(bool *)((long)&size + 7),true);
  if (dest_size_00 == (xr_reader *)0x0) {
    this_local = (xr_reader *)0x0;
  }
  else {
    if (((size._7_1_ ^ 0xff) & 1) == 0) {
      __assert_fail("!compressed",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_reader.cxx"
                    ,99,"size_t xray_re::xr_reader::r_raw_chunk(uint32_t, void *, size_t)");
    }
    if (pxStack_30 < dest_size_00) {
      __assert_fail("size <= dest_size",
                    "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_reader.cxx"
                    ,100,"size_t xray_re::xr_reader::r_raw_chunk(uint32_t, void *, size_t)");
    }
    r_raw(this,(void *)dest_size_local,(size_t)dest_size_00);
    this_local = dest_size_00;
  }
  return (size_t)this_local;
}

Assistant:

size_t xr_reader::r_raw_chunk(uint32_t id, void *dest, size_t dest_size)
{
	bool compressed;
	size_t size = find_chunk(id, &compressed);
	if (size == 0)
		return 0;
	assert(!compressed);
	assert(size <= dest_size);
	r_raw(dest, size);
	return size;
}